

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsbstrmatrix.cpp
# Opt level: O3

TPZStructMatrix * __thiscall
TPZSBandStructMatrix<double,_TPZStructMatrixOR<double>_>::Clone
          (TPZSBandStructMatrix<double,_TPZStructMatrixOR<double>_> *this)

{
  long lVar1;
  TPZStructMatrix *this_00;
  
  this_00 = (TPZStructMatrix *)operator_new(0xb8);
  lVar1 = *(long *)(*(long *)&(this->super_TPZStructMatrixT<double>).super_TPZStructMatrix + -0x60);
  *(undefined8 *)&this_00->field_0xa8 = 0x19b2068;
  *(undefined8 *)this_00 = 0x19b2130;
  *(undefined4 *)(this_00 + 1) =
       *(undefined4 *)
        ((long)&(this->super_TPZStructMatrixT<double>).super_TPZStructMatrix.fMesh + lVar1);
  this_00[1].field_0x4 =
       *(undefined1 *)
        ((long)&(this->super_TPZStructMatrixT<double>).super_TPZStructMatrix.fMesh + lVar1 + 4);
  TPZStructMatrix::TPZStructMatrix
            (this_00,&PTR_construction_vtable_104__019b1988,(TPZStructMatrix *)this);
  *(undefined8 *)&this_00->field_0xa8 = 0x19b1908;
  *(undefined8 *)this_00 = 0x19b1748;
  *(undefined8 *)&this_00->field_0xa0 = 0x19b1808;
  return this_00;
}

Assistant:

TPZStructMatrix * TPZSBandStructMatrix<TVar,TPar>::Clone(){
    return new TPZSBandStructMatrix(*this);
}